

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O2

void super_(_Bool canAssign)

{
  Token name;
  Token name_00;
  Token name_01;
  uint8_t byte2;
  _Bool _Var1;
  uint8_t byte;
  char *message;
  Token token_2;
  Token token_1;
  Token token;
  
  if (currentClass == (ClassCompiler *)0x0) {
    message = "Cannot use \'super\' outside of a class.";
  }
  else {
    if (currentClass->hasSuperclass != false) goto LAB_001042bb;
    message = "Cannot use \'super\' in a class with no superclass.";
  }
  error(message);
LAB_001042bb:
  consume(TOKEN_DOT,"Expect \'.\' after \'super\'.");
  consume(TOKEN_IDENTIFIER,"Expect superclass method name.");
  byte2 = identifierConstant(&parser.previous);
  name.line = token.line;
  name.length = 4;
  name.start = "this";
  name._0_8_ = token._0_8_;
  namedVariable(name,false);
  _Var1 = match(TOKEN_LEFT_PAREN);
  if (_Var1) {
    byte = argumentList();
    name_00.line = token_1.line;
    name_00.length = 5;
    name_00.start = "super";
    name_00._0_8_ = token_1._0_8_;
    namedVariable(name_00,false);
    emitBytes('\x1e',byte2);
    emitByte(byte);
    return;
  }
  name_01.line = token_2.line;
  name_01.length = 5;
  name_01.start = "super";
  name_01._0_8_ = token_2._0_8_;
  namedVariable(name_01,false);
  emitBytes('\x0e',byte2);
  return;
}

Assistant:

static void super_(bool canAssign) {
    if (currentClass == NULL) {
        error("Cannot use 'super' outside of a class.");
    } else if (!currentClass->hasSuperclass) {
        error("Cannot use 'super' in a class with no superclass.");
    }

    consume(TOKEN_DOT, "Expect '.' after 'super'.");
    consume(TOKEN_IDENTIFIER, "Expect superclass method name.");
    uint8_t name = identifierConstant(&parser.previous);

    namedVariable(syntheticToken("this"), false);

    if (match(TOKEN_LEFT_PAREN)) {
        uint8_t argCount = argumentList();
        namedVariable(syntheticToken("super"), false);
        emitBytes(OP_SUPER_INVOKE, name);
        emitByte(argCount);
    } else {
        namedVariable(syntheticToken("super"), false);
        emitBytes(OP_GET_SUPER, name);
    }
}